

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

int xsdTestSuite(xmlNodePtr cur)

{
  xmlChar *pxVar1;
  xmlChar *doc;
  xmlNodePtr cur_local;
  
  if ((verbose != 0) && (pxVar1 = getString(cur,"string(documentation)"), pxVar1 != (xmlChar *)0x0))
  {
    printf("Suite %s\n",pxVar1);
    (*_xmlFree)(pxVar1);
  }
  for (doc = (xmlChar *)getNext(cur,"./testCase[1]"); doc != (xmlChar *)0x0;
      doc = (xmlChar *)getNext((xmlNodePtr)doc,"following-sibling::testCase[1]")) {
    xsdTestCase((xmlNodePtr)doc);
  }
  return 0;
}

Assistant:

static int
xsdTestSuite(xmlNodePtr cur) {
    if (verbose) {
	xmlChar *doc = getString(cur, "string(documentation)");

	if (doc != NULL) {
	    printf("Suite %s\n", doc);
	    xmlFree(doc);
	}
    }
    cur = getNext(cur, "./testCase[1]");
    while (cur != NULL) {
        xsdTestCase(cur);
	cur = getNext(cur, "following-sibling::testCase[1]");
    }

    return(0);
}